

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

void __thiscall fasttext::Dictionary::load(Dictionary *this,istream *in)

{
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this_00;
  Dictionary *this_01;
  char cVar1;
  int32_t iVar2;
  mapped_type *pmVar3;
  int iVar4;
  int32_t i;
  long lVar5;
  int32_t i_1;
  long lVar6;
  undefined1 auVar7 [16];
  undefined8 in_XMM1_Qb;
  int32_t second;
  Dictionary *local_90;
  int32_t *local_88;
  int64_t *local_80;
  entry e;
  
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::clear(&this->words_);
  local_88 = &this->size_;
  std::istream::read((char *)in,(long)local_88);
  std::istream::read((char *)in,(long)&this->nwords_);
  std::istream::read((char *)in,(long)&this->nlabels_);
  std::istream::read((char *)in,(long)&this->ntokens_);
  local_80 = &this->pruneidx_size_;
  local_90 = this;
  std::istream::read((char *)in,(long)local_80);
  for (iVar4 = 0; iVar4 < *local_88; iVar4 = iVar4 + 1) {
    e.word._M_string_length = 0;
    e.word.field_2._M_local_buf[0] = '\0';
    e.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    e.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    e.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    e.word._M_dataplus._M_p = (pointer)&e.word.field_2;
    while( true ) {
      cVar1 = std::istream::get();
      if (cVar1 == '\0') break;
      std::__cxx11::string::push_back((char)&e);
    }
    std::istream::read((char *)in,(long)&e.count);
    std::istream::read((char *)in,(long)&e.type);
    std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::push_back(&this->words_,&e);
    entry::~entry(&e);
  }
  this_00 = &local_90->pruneidx_;
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&this_00->_M_h);
  for (lVar5 = 0; this_01 = local_90, lVar5 < *local_80; lVar5 = lVar5 + 1) {
    std::istream::read((char *)in,(long)&e);
    std::istream::read((char *)in,(long)&second);
    iVar2 = second;
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,(key_type *)&e);
    *pmVar3 = iVar2;
  }
  initTableDiscard(local_90);
  initNgrams(this_01);
  auVar7._0_8_ = (double)this_01->size_ / 0.7;
  auVar7._8_8_ = in_XMM1_Qb;
  auVar7 = vroundsd_avx(auVar7,auVar7,10);
  e.word._M_dataplus._M_p._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this_01->word2int_,(long)(int)auVar7._0_8_,(value_type_conflict1 *)&e);
  lVar5 = 0;
  for (lVar6 = 0; lVar6 < *local_88; lVar6 = lVar6 + 1) {
    iVar2 = find(this_01,(string *)
                         ((long)&(((this_01->words_).
                                   super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->word)._M_dataplus.
                                 _M_p + lVar5));
    (this_01->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[iVar2] = (int)lVar6;
    lVar5 = lVar5 + 0x48;
  }
  return;
}

Assistant:

void Dictionary::load(std::istream& in) {
  words_.clear();
  in.read((char*)&size_, sizeof(int32_t));
  in.read((char*)&nwords_, sizeof(int32_t));
  in.read((char*)&nlabels_, sizeof(int32_t));
  in.read((char*)&ntokens_, sizeof(int64_t));
  in.read((char*)&pruneidx_size_, sizeof(int64_t));
  for (int32_t i = 0; i < size_; i++) {
    char c;
    entry e;
    while ((c = in.get()) != 0) {
      e.word.push_back(c);
    }
    in.read((char*)&e.count, sizeof(int64_t));
    in.read((char*)&e.type, sizeof(entry_type));
    words_.push_back(e);
  }
  pruneidx_.clear();
  for (int32_t i = 0; i < pruneidx_size_; i++) {
    int32_t first;
    int32_t second;
    in.read((char*)&first, sizeof(int32_t));
    in.read((char*)&second, sizeof(int32_t));
    pruneidx_[first] = second;
  }
  initTableDiscard();
  initNgrams();

  int32_t word2intsize = std::ceil(size_ / 0.7);
  word2int_.assign(word2intsize, -1);
  for (int32_t i = 0; i < size_; i++) {
    word2int_[find(words_[i].word)] = i;
  }
}